

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  long lVar1;
  int32_t iVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Item *pIVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  Real RVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  byte bVar17;
  long lVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  pointer pnVar21;
  uint *puVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  pointer pnVar25;
  uint *puVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  fpclass_type fVar28;
  long in_FS_OFFSET;
  byte bVar29;
  type t;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  cpp_dec_float<200U,_int,_void> local_fe8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f68;
  long local_f60;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_f58;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_f40;
  cpp_dec_float<200U,_int,_void> local_f28;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_ea0;
  undefined8 local_e88;
  undefined8 uStack_e80;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e70;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e58;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e40;
  undefined4 local_e28;
  uint uStack_e24;
  undefined4 uStack_e20;
  uint uStack_e1c;
  long local_e10;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_e08;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_df0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_dd8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_dc0;
  cpp_dec_float<200U,_int,_void> local_da8;
  cpp_dec_float<200U,_int,_void> local_d28;
  cpp_dec_float<200U,_int,_void> local_ca8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c28;
  cpp_dec_float<200U,_int,_void> local_ba8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_aa8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_928;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a8;
  cpp_dec_float<200U,_int,_void> local_828;
  uint local_7a4 [27];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_738;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_638;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar29 = 0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_e40,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_e58,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_e70,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_ea0,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_f40,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_f58,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  pnVar20 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_objoffset;
  pnVar19 = pnVar20;
  pcVar13 = &local_238;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar13->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  iVar11 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_objoffset.m_backend.exp;
  bVar8 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_objoffset.m_backend.neg;
  fVar28 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_objoffset.m_backend.fpclass;
  iVar2 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_objoffset.m_backend.prec_elem;
  pnVar19 = pnVar20;
  pcVar13 = &local_2b8;
  local_238.exp = iVar11;
  local_238.neg = bVar8;
  local_238.fpclass = fVar28;
  local_238.prec_elem = iVar2;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar13->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  pnVar19 = pnVar20;
  pcVar13 = &local_338;
  local_2b8.exp = iVar11;
  local_2b8.neg = bVar8;
  local_2b8.fpclass = fVar28;
  local_2b8.prec_elem = iVar2;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar13->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + (ulong)bVar29 * -8 + 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  pcVar13 = &local_3b8;
  local_338.exp = iVar11;
  local_338.neg = bVar8;
  local_338.fpclass = fVar28;
  local_338.prec_elem = iVar2;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar13->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
    pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar20 + (ulong)bVar29 * -8 + 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
  }
  local_3b8.exp = iVar11;
  local_3b8.neg = bVar8;
  local_3b8.fpclass = fVar28;
  local_3b8.prec_elem = iVar2;
  ::soplex::infinity::__tls_init();
  local_e88 = *(double *)(in_FS_OFFSET + -8);
  local_ca8.fpclass = cpp_dec_float_finite;
  local_ca8.prec_elem = 0x1c;
  local_ca8.data._M_elems[0] = 0;
  local_ca8.data._M_elems[1] = 0;
  local_ca8.data._M_elems[2] = 0;
  local_ca8.data._M_elems[3] = 0;
  local_ca8.data._M_elems[4] = 0;
  local_ca8.data._M_elems[5] = 0;
  local_ca8.data._M_elems[6] = 0;
  local_ca8.data._M_elems[7] = 0;
  local_ca8.data._M_elems[8] = 0;
  local_ca8.data._M_elems[9] = 0;
  local_ca8.data._M_elems[10] = 0;
  local_ca8.data._M_elems[0xb] = 0;
  local_ca8.data._M_elems[0xc] = 0;
  local_ca8.data._M_elems[0xd] = 0;
  local_ca8.data._M_elems[0xe] = 0;
  local_ca8.data._M_elems[0xf] = 0;
  local_ca8.data._M_elems[0x10] = 0;
  local_ca8.data._M_elems[0x11] = 0;
  local_ca8.data._M_elems[0x12] = 0;
  local_ca8.data._M_elems[0x13] = 0;
  local_ca8.data._M_elems[0x14] = 0;
  local_ca8.data._M_elems[0x15] = 0;
  local_ca8.data._M_elems[0x16] = 0;
  local_ca8.data._M_elems[0x17] = 0;
  local_ca8.data._M_elems[0x18] = 0;
  local_ca8.data._M_elems[0x19] = 0;
  local_ca8.data._M_elems._104_5_ = 0;
  local_ca8.data._M_elems[0x1b]._1_3_ = 0;
  local_ca8.exp = 0;
  local_ca8.neg = false;
  uStack_e80 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_ca8,local_e88);
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_f28,this);
  local_828.fpclass = cpp_dec_float_finite;
  local_828.prec_elem = 0x1c;
  local_828.data._M_elems[0] = 0;
  local_828.data._M_elems[1] = 0;
  local_828.data._M_elems[2] = 0;
  local_828.data._M_elems[3] = 0;
  local_828.data._M_elems[4] = 0;
  local_828.data._M_elems[5] = 0;
  local_828.data._M_elems[6] = 0;
  local_828.data._M_elems[7] = 0;
  local_828.data._M_elems[8] = 0;
  local_828.data._M_elems[9] = 0;
  local_828.data._M_elems[10] = 0;
  local_828.data._M_elems[0xb] = 0;
  local_828.data._M_elems[0xc] = 0;
  local_828.data._M_elems[0xd] = 0;
  local_828.data._M_elems[0xe] = 0;
  local_828.data._M_elems[0xf] = 0;
  local_828.data._M_elems[0x10] = 0;
  local_828.data._M_elems[0x11] = 0;
  local_828.data._M_elems[0x12] = 0;
  local_828.data._M_elems[0x13] = 0;
  local_828.data._M_elems[0x14] = 0;
  local_828.data._M_elems[0x15] = 0;
  local_828.data._M_elems[0x16] = 0;
  local_828.data._M_elems[0x17] = 0;
  local_828.data._M_elems[0x18] = 0;
  local_828.data._M_elems[0x19] = 0;
  local_828.data._M_elems._104_5_ = 0;
  local_828.data._M_elems[0x1b]._1_3_ = 0;
  local_828.exp = 0;
  local_828.neg = false;
  local_fe8.fpclass = cpp_dec_float_finite;
  local_fe8.prec_elem = 0x1c;
  local_fe8.data._M_elems[0] = 0;
  local_fe8.data._M_elems[1] = 0;
  local_fe8.data._M_elems[2] = 0;
  local_fe8.data._M_elems[3] = 0;
  local_fe8.data._M_elems[4] = 0;
  local_fe8.data._M_elems[5] = 0;
  local_fe8.data._M_elems[6] = 0;
  local_fe8.data._M_elems[7] = 0;
  local_fe8.data._M_elems[8] = 0;
  local_fe8.data._M_elems[9] = 0;
  local_fe8.data._M_elems[10] = 0;
  local_fe8.data._M_elems[0xb] = 0;
  local_fe8.data._M_elems[0xc] = 0;
  local_fe8.data._M_elems[0xd] = 0;
  local_fe8.data._M_elems[0xe] = 0;
  local_fe8.data._M_elems[0xf] = 0;
  local_fe8.data._M_elems[0x10] = 0;
  local_fe8.data._M_elems[0x11] = 0;
  local_fe8.data._M_elems[0x12] = 0;
  local_fe8.data._M_elems[0x13] = 0;
  local_fe8.data._M_elems[0x14] = 0;
  local_fe8.data._M_elems[0x15] = 0;
  local_fe8.data._M_elems[0x16] = 0;
  local_fe8.data._M_elems[0x17] = 0;
  local_fe8.data._M_elems[0x18] = 0;
  local_fe8.data._M_elems[0x19] = 0;
  local_fe8.data._M_elems._104_5_ = 0;
  local_fe8.data._M_elems[0x1b]._1_3_ = 0;
  local_fe8.exp = 0;
  local_fe8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_fe8,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_828,&local_fe8,&local_f28);
  ::soplex::infinity::__tls_init();
  local_138.m_backend.fpclass = cpp_dec_float_finite;
  local_138.m_backend.prec_elem = 0x1c;
  local_138.m_backend.data._M_elems[0] = 0;
  local_138.m_backend.data._M_elems[1] = 0;
  local_138.m_backend.data._M_elems[2] = 0;
  local_138.m_backend.data._M_elems[3] = 0;
  local_138.m_backend.data._M_elems[4] = 0;
  local_138.m_backend.data._M_elems[5] = 0;
  local_138.m_backend.data._M_elems[6] = 0;
  local_138.m_backend.data._M_elems[7] = 0;
  local_138.m_backend.data._M_elems[8] = 0;
  local_138.m_backend.data._M_elems[9] = 0;
  local_138.m_backend.data._M_elems[10] = 0;
  local_138.m_backend.data._M_elems[0xb] = 0;
  local_138.m_backend.data._M_elems[0xc] = 0;
  local_138.m_backend.data._M_elems[0xd] = 0;
  local_138.m_backend.data._M_elems[0xe] = 0;
  local_138.m_backend.data._M_elems[0xf] = 0;
  local_138.m_backend.data._M_elems[0x10] = 0;
  local_138.m_backend.data._M_elems[0x11] = 0;
  local_138.m_backend.data._M_elems[0x12] = 0;
  local_138.m_backend.data._M_elems[0x13] = 0;
  local_138.m_backend.data._M_elems[0x14] = 0;
  local_138.m_backend.data._M_elems[0x15] = 0;
  local_138.m_backend.data._M_elems[0x16] = 0;
  local_138.m_backend.data._M_elems[0x17] = 0;
  local_138.m_backend.data._M_elems[0x18] = 0;
  local_138.m_backend.data._M_elems[0x19] = 0;
  local_138.m_backend.data._M_elems._104_5_ = 0;
  local_138.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_138.m_backend.exp = 0;
  local_138.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_138,local_e88);
  pTVar3 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  RVar7 = Tolerances::epsilon(pTVar3);
  bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_828,&local_138,RVar7);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (bVar8) {
    feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_d28,this);
    local_f28.fpclass = cpp_dec_float_finite;
    local_f28.prec_elem = 0x1c;
    local_f28.data._M_elems[0] = 0;
    local_f28.data._M_elems[1] = 0;
    local_f28.data._M_elems[2] = 0;
    local_f28.data._M_elems[3] = 0;
    local_f28.data._M_elems[4] = 0;
    local_f28.data._M_elems[5] = 0;
    local_f28.data._M_elems[6] = 0;
    local_f28.data._M_elems[7] = 0;
    local_f28.data._M_elems[8] = 0;
    local_f28.data._M_elems[9] = 0;
    local_f28.data._M_elems[10] = 0;
    local_f28.data._M_elems[0xb] = 0;
    local_f28.data._M_elems[0xc] = 0;
    local_f28.data._M_elems[0xd] = 0;
    local_f28.data._M_elems[0xe] = 0;
    local_f28.data._M_elems[0xf] = 0;
    local_f28.data._M_elems[0x10] = 0;
    local_f28.data._M_elems[0x11] = 0;
    local_f28.data._M_elems[0x12] = 0;
    local_f28.data._M_elems[0x13] = 0;
    local_f28.data._M_elems[0x14] = 0;
    local_f28.data._M_elems[0x15] = 0;
    local_f28.data._M_elems[0x16] = 0;
    local_f28.data._M_elems[0x17] = 0;
    local_f28.data._M_elems[0x18] = 0;
    local_f28.data._M_elems[0x19] = 0;
    local_f28.data._M_elems._104_5_ = 0;
    local_f28.data._M_elems[0x1b]._1_3_ = 0;
    local_f28.exp = 0;
    local_f28.neg = false;
    local_fe8.fpclass = cpp_dec_float_finite;
    local_fe8.prec_elem = 0x1c;
    local_fe8.data._M_elems[0] = 0;
    local_fe8.data._M_elems[1] = 0;
    local_fe8.data._M_elems[2] = 0;
    local_fe8.data._M_elems[3] = 0;
    local_fe8.data._M_elems[4] = 0;
    local_fe8.data._M_elems[5] = 0;
    local_fe8.data._M_elems[6] = 0;
    local_fe8.data._M_elems[7] = 0;
    local_fe8.data._M_elems[8] = 0;
    local_fe8.data._M_elems[9] = 0;
    local_fe8.data._M_elems[10] = 0;
    local_fe8.data._M_elems[0xb] = 0;
    local_fe8.data._M_elems[0xc] = 0;
    local_fe8.data._M_elems[0xd] = 0;
    local_fe8.data._M_elems[0xe] = 0;
    local_fe8.data._M_elems[0xf] = 0;
    local_fe8.data._M_elems[0x10] = 0;
    local_fe8.data._M_elems[0x11] = 0;
    local_fe8.data._M_elems[0x12] = 0;
    local_fe8.data._M_elems[0x13] = 0;
    local_fe8.data._M_elems[0x14] = 0;
    local_fe8.data._M_elems[0x15] = 0;
    local_fe8.data._M_elems[0x16] = 0;
    local_fe8.data._M_elems[0x17] = 0;
    local_fe8.data._M_elems[0x18] = 0;
    local_fe8.data._M_elems[0x19] = 0;
    local_fe8.data._M_elems._104_5_ = 0;
    local_fe8.data._M_elems[0x1b]._1_3_ = 0;
    local_fe8.exp = 0;
    local_fe8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_fe8,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_f28,&local_fe8,&local_d28);
    pcVar13 = &local_f28;
    pcVar23 = &local_ca8;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pcVar23->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
    }
    local_ca8.exp = local_f28.exp;
    local_ca8.neg = local_f28.neg;
    local_ca8.fpclass = local_f28.fpclass;
    local_ca8.prec_elem = local_f28.prec_elem;
  }
  lVar14 = (long)(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (lVar14 < 1) {
    bVar8 = true;
  }
  else {
    uStack_e24 = local_e88._4_4_ ^ 0x80000000;
    uStack_e1c = uStack_e80._4_4_ ^ 0x80000000;
    local_e28 = (undefined4)local_e88;
    uStack_e20 = (undefined4)uStack_e80;
    bVar8 = true;
    do {
      lVar1 = lVar14 + -1;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&local_f40.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&local_f58.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,0);
      pIVar5 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      local_e10 = lVar1;
      iVar11 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar1].idx;
      local_f60 = lVar14;
      if (0 < pIVar5[iVar11].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar5 = pIVar5 + iVar11;
        lVar18 = 0;
        lVar14 = 0;
        do {
          pNVar6 = (pIVar5->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar22 = (uint *)((long)&(pNVar6->val).m_backend.data + lVar18);
          pcVar13 = &local_f28;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar13->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
          }
          local_f28.exp = *(int *)((long)&(pNVar6->val).m_backend.data + lVar18 + 0x70);
          local_f28.neg = *(bool *)((long)&(pNVar6->val).m_backend.data + lVar18 + 0x74);
          local_f28._120_8_ = *(undefined8 *)((long)&(pNVar6->val).m_backend.data + lVar18 + 0x78);
          iVar11 = *(int *)((long)(&((pIVar5->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar18);
          pnVar25 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar21 = pnVar25 + iVar11;
          pnVar20 = &local_438;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_438.m_backend.exp = pnVar25[iVar11].m_backend.exp;
          local_438.m_backend.neg = pnVar25[iVar11].m_backend.neg;
          local_438.m_backend.fpclass = pnVar25[iVar11].m_backend.fpclass;
          local_438.m_backend.prec_elem = pnVar25[iVar11].m_backend.prec_elem;
          ::soplex::infinity::__tls_init();
          local_8a8.m_backend.fpclass = cpp_dec_float_finite;
          local_8a8.m_backend.prec_elem = 0x1c;
          local_8a8.m_backend.data._M_elems[0] = 0;
          local_8a8.m_backend.data._M_elems[1] = 0;
          local_8a8.m_backend.data._M_elems[2] = 0;
          local_8a8.m_backend.data._M_elems[3] = 0;
          local_8a8.m_backend.data._M_elems[4] = 0;
          local_8a8.m_backend.data._M_elems[5] = 0;
          local_8a8.m_backend.data._M_elems[6] = 0;
          local_8a8.m_backend.data._M_elems[7] = 0;
          local_8a8.m_backend.data._M_elems[8] = 0;
          local_8a8.m_backend.data._M_elems[9] = 0;
          local_8a8.m_backend.data._M_elems[10] = 0;
          local_8a8.m_backend.data._M_elems[0xb] = 0;
          local_8a8.m_backend.data._M_elems[0xc] = 0;
          local_8a8.m_backend.data._M_elems[0xd] = 0;
          local_8a8.m_backend.data._M_elems[0xe] = 0;
          local_8a8.m_backend.data._M_elems[0xf] = 0;
          local_8a8.m_backend.data._M_elems[0x10] = 0;
          local_8a8.m_backend.data._M_elems[0x11] = 0;
          local_8a8.m_backend.data._M_elems[0x12] = 0;
          local_8a8.m_backend.data._M_elems[0x13] = 0;
          local_8a8.m_backend.data._M_elems[0x14] = 0;
          local_8a8.m_backend.data._M_elems[0x15] = 0;
          local_8a8.m_backend.data._M_elems[0x16] = 0;
          local_8a8.m_backend.data._M_elems[0x17] = 0;
          local_8a8.m_backend.data._M_elems[0x18] = 0;
          local_8a8.m_backend.data._M_elems[0x19] = 0;
          local_8a8.m_backend.data._M_elems._104_5_ = 0;
          local_8a8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_8a8.m_backend.exp = 0;
          local_8a8.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_8a8,
                     (double)CONCAT44(uStack_e24,local_e28));
          pTVar3 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var4 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          RVar7 = Tolerances::epsilon(pTVar3);
          bVar9 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_438,&local_8a8,RVar7);
          if (bVar9) {
            iVar11 = *(int *)((long)(&((pIVar5->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar18);
            pnVar25 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar21 = pnVar25 + iVar11;
            pnVar20 = &local_4b8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pnVar20->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
              pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_4b8.m_backend.exp = pnVar25[iVar11].m_backend.exp;
            local_4b8.m_backend.neg = pnVar25[iVar11].m_backend.neg;
            local_4b8.m_backend.fpclass = pnVar25[iVar11].m_backend.fpclass;
            local_4b8.m_backend.prec_elem = pnVar25[iVar11].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_928.m_backend.fpclass = cpp_dec_float_finite;
            local_928.m_backend.prec_elem = 0x1c;
            local_928.m_backend.data._M_elems[0] = 0;
            local_928.m_backend.data._M_elems[1] = 0;
            local_928.m_backend.data._M_elems[2] = 0;
            local_928.m_backend.data._M_elems[3] = 0;
            local_928.m_backend.data._M_elems[4] = 0;
            local_928.m_backend.data._M_elems[5] = 0;
            local_928.m_backend.data._M_elems[6] = 0;
            local_928.m_backend.data._M_elems[7] = 0;
            local_928.m_backend.data._M_elems[8] = 0;
            local_928.m_backend.data._M_elems[9] = 0;
            local_928.m_backend.data._M_elems[10] = 0;
            local_928.m_backend.data._M_elems[0xb] = 0;
            local_928.m_backend.data._M_elems[0xc] = 0;
            local_928.m_backend.data._M_elems[0xd] = 0;
            local_928.m_backend.data._M_elems[0xe] = 0;
            local_928.m_backend.data._M_elems[0xf] = 0;
            local_928.m_backend.data._M_elems[0x10] = 0;
            local_928.m_backend.data._M_elems[0x11] = 0;
            local_928.m_backend.data._M_elems[0x12] = 0;
            local_928.m_backend.data._M_elems[0x13] = 0;
            local_928.m_backend.data._M_elems[0x14] = 0;
            local_928.m_backend.data._M_elems[0x15] = 0;
            local_928.m_backend.data._M_elems[0x16] = 0;
            local_928.m_backend.data._M_elems[0x17] = 0;
            local_928.m_backend.data._M_elems[0x18] = 0;
            local_928.m_backend.data._M_elems[0x19] = 0;
            local_928.m_backend.data._M_elems._104_5_ = 0;
            local_928.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            local_928.m_backend.exp = 0;
            local_928.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_928,local_e88);
            pTVar3 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_f68 = (this->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )._tolerances.
                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
            if (local_f68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_f68->_M_use_count = local_f68->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_f68->_M_use_count = local_f68->_M_use_count + 1;
              }
            }
            RVar7 = Tolerances::epsilon(pTVar3);
            bVar10 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               (&local_4b8,&local_928,RVar7);
          }
          else {
            bVar10 = false;
          }
          if (bVar9 && local_f68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f68);
          }
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          pnVar25 = local_f40.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (bVar10 == false) {
            iVar11 = *(int *)((long)(&((pIVar5->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar18);
            pnVar25 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar21 = pnVar25 + iVar11;
            pnVar20 = &local_538;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pnVar20->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
              pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_538.m_backend.exp = pnVar25[iVar11].m_backend.exp;
            local_538.m_backend.neg = pnVar25[iVar11].m_backend.neg;
            local_538.m_backend.fpclass = pnVar25[iVar11].m_backend.fpclass;
            local_538.m_backend.prec_elem = pnVar25[iVar11].m_backend.prec_elem;
            ::soplex::infinity::__tls_init();
            local_9a8.m_backend.fpclass = cpp_dec_float_finite;
            local_9a8.m_backend.prec_elem = 0x1c;
            local_9a8.m_backend.data._M_elems[0] = 0;
            local_9a8.m_backend.data._M_elems[1] = 0;
            local_9a8.m_backend.data._M_elems[2] = 0;
            local_9a8.m_backend.data._M_elems[3] = 0;
            local_9a8.m_backend.data._M_elems[4] = 0;
            local_9a8.m_backend.data._M_elems[5] = 0;
            local_9a8.m_backend.data._M_elems[6] = 0;
            local_9a8.m_backend.data._M_elems[7] = 0;
            local_9a8.m_backend.data._M_elems[8] = 0;
            local_9a8.m_backend.data._M_elems[9] = 0;
            local_9a8.m_backend.data._M_elems[10] = 0;
            local_9a8.m_backend.data._M_elems[0xb] = 0;
            local_9a8.m_backend.data._M_elems[0xc] = 0;
            local_9a8.m_backend.data._M_elems[0xd] = 0;
            local_9a8.m_backend.data._M_elems[0xe] = 0;
            local_9a8.m_backend.data._M_elems[0xf] = 0;
            local_9a8.m_backend.data._M_elems[0x10] = 0;
            local_9a8.m_backend.data._M_elems[0x11] = 0;
            local_9a8.m_backend.data._M_elems[0x12] = 0;
            local_9a8.m_backend.data._M_elems[0x13] = 0;
            local_9a8.m_backend.data._M_elems[0x14] = 0;
            local_9a8.m_backend.data._M_elems[0x15] = 0;
            local_9a8.m_backend.data._M_elems[0x16] = 0;
            local_9a8.m_backend.data._M_elems[0x17] = 0;
            local_9a8.m_backend.data._M_elems[0x18] = 0;
            local_9a8.m_backend.data._M_elems[0x19] = 0;
            local_9a8.m_backend.data._M_elems._104_5_ = 0;
            local_9a8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            local_9a8.m_backend.exp = 0;
            local_9a8.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_9a8,
                       (double)CONCAT44(uStack_e24,local_e28));
            pTVar3 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var4 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              }
            }
            RVar7 = Tolerances::epsilon(pTVar3);
            bVar9 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (&local_538,&local_9a8,RVar7);
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if (bVar9) {
              if (local_f28.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f28,&local_fe8);
                pnVar25 = local_f58.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < iVar11) {
                  local_fe8.fpclass = cpp_dec_float_finite;
                  local_fe8.prec_elem = 0x1c;
                  local_fe8.data._M_elems[0] = 0;
                  local_fe8.data._M_elems[1] = 0;
                  local_fe8.data._M_elems[2] = 0;
                  local_fe8.data._M_elems[3] = 0;
                  local_fe8.data._M_elems[4] = 0;
                  local_fe8.data._M_elems[5] = 0;
                  local_fe8.data._M_elems[6] = 0;
                  local_fe8.data._M_elems[7] = 0;
                  local_fe8.data._M_elems[8] = 0;
                  local_fe8.data._M_elems[9] = 0;
                  local_fe8.data._M_elems[10] = 0;
                  local_fe8.data._M_elems[0xb] = 0;
                  local_fe8.data._M_elems[0xc] = 0;
                  local_fe8.data._M_elems[0xd] = 0;
                  local_fe8.data._M_elems[0xe] = 0;
                  local_fe8.data._M_elems[0xf] = 0;
                  local_fe8.data._M_elems[0x10] = 0;
                  local_fe8.data._M_elems[0x11] = 0;
                  local_fe8.data._M_elems[0x12] = 0;
                  local_fe8.data._M_elems[0x13] = 0;
                  local_fe8.data._M_elems[0x14] = 0;
                  local_fe8.data._M_elems[0x15] = 0;
                  local_fe8.data._M_elems[0x16] = 0;
                  local_fe8.data._M_elems[0x17] = 0;
                  local_fe8.data._M_elems[0x18] = 0;
                  local_fe8.data._M_elems[0x19] = 0;
                  local_fe8.data._M_elems._104_5_ = 0;
                  local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                  local_fe8.exp = 0;
                  local_fe8.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  from_unsigned_long_long(&local_fe8,1);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (&pnVar25[lVar1].m_backend,&local_fe8);
                  goto LAB_0056d8b8;
                }
              }
              if (local_f28.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f28,&local_fe8);
                pnVar25 = local_f40.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (iVar11 < 0) {
                  local_fe8.fpclass = cpp_dec_float_finite;
                  local_fe8.prec_elem = 0x1c;
                  local_fe8.data._M_elems[0] = 0;
                  local_fe8.data._M_elems[1] = 0;
                  local_fe8.data._M_elems[2] = 0;
                  local_fe8.data._M_elems[3] = 0;
                  local_fe8.data._M_elems[4] = 0;
                  local_fe8.data._M_elems[5] = 0;
                  local_fe8.data._M_elems[6] = 0;
                  local_fe8.data._M_elems[7] = 0;
                  local_fe8.data._M_elems[8] = 0;
                  local_fe8.data._M_elems[9] = 0;
                  local_fe8.data._M_elems[10] = 0;
                  local_fe8.data._M_elems[0xb] = 0;
                  local_fe8.data._M_elems[0xc] = 0;
                  local_fe8.data._M_elems[0xd] = 0;
                  local_fe8.data._M_elems[0xe] = 0;
                  local_fe8.data._M_elems[0xf] = 0;
                  local_fe8.data._M_elems[0x10] = 0;
                  local_fe8.data._M_elems[0x11] = 0;
                  local_fe8.data._M_elems[0x12] = 0;
                  local_fe8.data._M_elems[0x13] = 0;
                  local_fe8.data._M_elems[0x14] = 0;
                  local_fe8.data._M_elems[0x15] = 0;
                  local_fe8.data._M_elems[0x16] = 0;
                  local_fe8.data._M_elems[0x17] = 0;
                  local_fe8.data._M_elems[0x18] = 0;
                  local_fe8.data._M_elems[0x19] = 0;
                  local_fe8.data._M_elems._104_5_ = 0;
                  local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                  local_fe8.exp = 0;
                  local_fe8.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  from_unsigned_long_long(&local_fe8,1);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (&pnVar25[lVar1].m_backend,&local_fe8);
                }
              }
            }
            else {
              iVar11 = *(int *)((long)(&((pIVar5->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar18);
              pnVar25 = (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar21 = pnVar25 + iVar11;
              pnVar20 = &local_5b8;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
                pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_5b8.m_backend.exp = pnVar25[iVar11].m_backend.exp;
              local_5b8.m_backend.neg = pnVar25[iVar11].m_backend.neg;
              local_5b8.m_backend.fpclass = pnVar25[iVar11].m_backend.fpclass;
              local_5b8.m_backend.prec_elem = pnVar25[iVar11].m_backend.prec_elem;
              ::soplex::infinity::__tls_init();
              local_a28.m_backend.fpclass = cpp_dec_float_finite;
              local_a28.m_backend.prec_elem = 0x1c;
              local_a28.m_backend.data._M_elems[0] = 0;
              local_a28.m_backend.data._M_elems[1] = 0;
              local_a28.m_backend.data._M_elems[2] = 0;
              local_a28.m_backend.data._M_elems[3] = 0;
              local_a28.m_backend.data._M_elems[4] = 0;
              local_a28.m_backend.data._M_elems[5] = 0;
              local_a28.m_backend.data._M_elems[6] = 0;
              local_a28.m_backend.data._M_elems[7] = 0;
              local_a28.m_backend.data._M_elems[8] = 0;
              local_a28.m_backend.data._M_elems[9] = 0;
              local_a28.m_backend.data._M_elems[10] = 0;
              local_a28.m_backend.data._M_elems[0xb] = 0;
              local_a28.m_backend.data._M_elems[0xc] = 0;
              local_a28.m_backend.data._M_elems[0xd] = 0;
              local_a28.m_backend.data._M_elems[0xe] = 0;
              local_a28.m_backend.data._M_elems[0xf] = 0;
              local_a28.m_backend.data._M_elems[0x10] = 0;
              local_a28.m_backend.data._M_elems[0x11] = 0;
              local_a28.m_backend.data._M_elems[0x12] = 0;
              local_a28.m_backend.data._M_elems[0x13] = 0;
              local_a28.m_backend.data._M_elems[0x14] = 0;
              local_a28.m_backend.data._M_elems[0x15] = 0;
              local_a28.m_backend.data._M_elems[0x16] = 0;
              local_a28.m_backend.data._M_elems[0x17] = 0;
              local_a28.m_backend.data._M_elems[0x18] = 0;
              local_a28.m_backend.data._M_elems[0x19] = 0;
              local_a28.m_backend.data._M_elems._104_5_ = 0;
              local_a28.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              local_a28.m_backend.exp = 0;
              local_a28.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_a28,local_e88);
              pTVar3 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var4 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                }
              }
              RVar7 = Tolerances::epsilon(pTVar3);
              bVar9 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (&local_5b8,&local_a28,RVar7);
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              }
              if (bVar9) {
                if (local_f28.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                  iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_f28,&local_fe8);
                  pnVar25 = local_f40.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (0 < iVar11) {
                    local_fe8.fpclass = cpp_dec_float_finite;
                    local_fe8.prec_elem = 0x1c;
                    local_fe8.data._M_elems[0] = 0;
                    local_fe8.data._M_elems[1] = 0;
                    local_fe8.data._M_elems[2] = 0;
                    local_fe8.data._M_elems[3] = 0;
                    local_fe8.data._M_elems[4] = 0;
                    local_fe8.data._M_elems[5] = 0;
                    local_fe8.data._M_elems[6] = 0;
                    local_fe8.data._M_elems[7] = 0;
                    local_fe8.data._M_elems[8] = 0;
                    local_fe8.data._M_elems[9] = 0;
                    local_fe8.data._M_elems[10] = 0;
                    local_fe8.data._M_elems[0xb] = 0;
                    local_fe8.data._M_elems[0xc] = 0;
                    local_fe8.data._M_elems[0xd] = 0;
                    local_fe8.data._M_elems[0xe] = 0;
                    local_fe8.data._M_elems[0xf] = 0;
                    local_fe8.data._M_elems[0x10] = 0;
                    local_fe8.data._M_elems[0x11] = 0;
                    local_fe8.data._M_elems[0x12] = 0;
                    local_fe8.data._M_elems[0x13] = 0;
                    local_fe8.data._M_elems[0x14] = 0;
                    local_fe8.data._M_elems[0x15] = 0;
                    local_fe8.data._M_elems[0x16] = 0;
                    local_fe8.data._M_elems[0x17] = 0;
                    local_fe8.data._M_elems[0x18] = 0;
                    local_fe8.data._M_elems[0x19] = 0;
                    local_fe8.data._M_elems._104_5_ = 0;
                    local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                    local_fe8.exp = 0;
                    local_fe8.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    from_unsigned_long_long(&local_fe8,1);
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                              (&pnVar25[lVar1].m_backend,&local_fe8);
                    goto LAB_0056d8b8;
                  }
                }
                if (local_f28.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>(&local_fe8,0,(type *)0x0);
                  iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_f28,&local_fe8);
                  pnVar25 = local_f58.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (iVar11 < 0) {
                    local_fe8.fpclass = cpp_dec_float_finite;
                    local_fe8.prec_elem = 0x1c;
                    local_fe8.data._M_elems[0] = 0;
                    local_fe8.data._M_elems[1] = 0;
                    local_fe8.data._M_elems[2] = 0;
                    local_fe8.data._M_elems[3] = 0;
                    local_fe8.data._M_elems[4] = 0;
                    local_fe8.data._M_elems[5] = 0;
                    local_fe8.data._M_elems[6] = 0;
                    local_fe8.data._M_elems[7] = 0;
                    local_fe8.data._M_elems[8] = 0;
                    local_fe8.data._M_elems[9] = 0;
                    local_fe8.data._M_elems[10] = 0;
                    local_fe8.data._M_elems[0xb] = 0;
                    local_fe8.data._M_elems[0xc] = 0;
                    local_fe8.data._M_elems[0xd] = 0;
                    local_fe8.data._M_elems[0xe] = 0;
                    local_fe8.data._M_elems[0xf] = 0;
                    local_fe8.data._M_elems[0x10] = 0;
                    local_fe8.data._M_elems[0x11] = 0;
                    local_fe8.data._M_elems[0x12] = 0;
                    local_fe8.data._M_elems[0x13] = 0;
                    local_fe8.data._M_elems[0x14] = 0;
                    local_fe8.data._M_elems[0x15] = 0;
                    local_fe8.data._M_elems[0x16] = 0;
                    local_fe8.data._M_elems[0x17] = 0;
                    local_fe8.data._M_elems[0x18] = 0;
                    local_fe8.data._M_elems[0x19] = 0;
                    local_fe8.data._M_elems._104_5_ = 0;
                    local_fe8.data._M_elems[0x1b]._1_3_ = 0;
                    local_fe8.exp = 0;
                    local_fe8.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    from_unsigned_long_long(&local_fe8,1);
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                              (&pnVar25[lVar1].m_backend,&local_fe8);
                  }
                }
              }
            }
          }
          else {
            local_fe8.fpclass = cpp_dec_float_finite;
            local_fe8.prec_elem = 0x1c;
            local_fe8.data._M_elems[0] = 0;
            local_fe8.data._M_elems[1] = 0;
            local_fe8.data._M_elems[2] = 0;
            local_fe8.data._M_elems[3] = 0;
            local_fe8.data._M_elems[4] = 0;
            local_fe8.data._M_elems[5] = 0;
            local_fe8.data._M_elems[6] = 0;
            local_fe8.data._M_elems[7] = 0;
            local_fe8.data._M_elems[8] = 0;
            local_fe8.data._M_elems[9] = 0;
            local_fe8.data._M_elems[10] = 0;
            local_fe8.data._M_elems[0xb] = 0;
            local_fe8.data._M_elems[0xc] = 0;
            local_fe8.data._M_elems[0xd] = 0;
            local_fe8.data._M_elems[0xe] = 0;
            local_fe8.data._M_elems[0xf] = 0;
            local_fe8.data._M_elems[0x10] = 0;
            local_fe8.data._M_elems[0x11] = 0;
            local_fe8.data._M_elems[0x12] = 0;
            local_fe8.data._M_elems[0x13] = 0;
            local_fe8.data._M_elems[0x14] = 0;
            local_fe8.data._M_elems[0x15] = 0;
            local_fe8.data._M_elems[0x16] = 0;
            local_fe8.data._M_elems[0x17] = 0;
            local_fe8.data._M_elems[0x18] = 0;
            local_fe8.data._M_elems[0x19] = 0;
            local_fe8.data._M_elems._104_5_ = 0;
            local_fe8.data._M_elems[0x1b]._1_3_ = 0;
            local_fe8.exp = 0;
            local_fe8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::from_unsigned_long_long
                      (&local_fe8,1);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&pnVar25[lVar1].m_backend,&local_fe8);
            pnVar25 = local_f58.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_fe8.fpclass = cpp_dec_float_finite;
            local_fe8.prec_elem = 0x1c;
            local_fe8.data._M_elems[0] = 0;
            local_fe8.data._M_elems[1] = 0;
            local_fe8.data._M_elems[2] = 0;
            local_fe8.data._M_elems[3] = 0;
            local_fe8.data._M_elems[4] = 0;
            local_fe8.data._M_elems[5] = 0;
            local_fe8.data._M_elems[6] = 0;
            local_fe8.data._M_elems[7] = 0;
            local_fe8.data._M_elems[8] = 0;
            local_fe8.data._M_elems[9] = 0;
            local_fe8.data._M_elems[10] = 0;
            local_fe8.data._M_elems[0xb] = 0;
            local_fe8.data._M_elems[0xc] = 0;
            local_fe8.data._M_elems[0xd] = 0;
            local_fe8.data._M_elems[0xe] = 0;
            local_fe8.data._M_elems[0xf] = 0;
            local_fe8.data._M_elems[0x10] = 0;
            local_fe8.data._M_elems[0x11] = 0;
            local_fe8.data._M_elems[0x12] = 0;
            local_fe8.data._M_elems[0x13] = 0;
            local_fe8.data._M_elems[0x14] = 0;
            local_fe8.data._M_elems[0x15] = 0;
            local_fe8.data._M_elems[0x16] = 0;
            local_fe8.data._M_elems[0x17] = 0;
            local_fe8.data._M_elems[0x18] = 0;
            local_fe8.data._M_elems[0x19] = 0;
            local_fe8.data._M_elems._104_5_ = 0;
            local_fe8.data._M_elems[0x1b]._1_3_ = 0;
            local_fe8.exp = 0;
            local_fe8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::from_unsigned_long_long
                      (&local_fe8,1);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&pnVar25[lVar1].m_backend,&local_fe8);
          }
LAB_0056d8b8:
          lVar14 = lVar14 + 1;
          lVar18 = lVar18 + 0x84;
        } while (lVar14 < (pIVar5->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      pnVar25 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar1;
      uVar16 = (pnVar25->m_backend).data._M_elems[0];
      puVar22 = (uint *)((long)&(pnVar25->m_backend).data + 4);
      puVar26 = local_7a4;
      for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar26 = *puVar22;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
      }
      iVar11 = (pnVar25->m_backend).exp;
      bVar17 = (pnVar25->m_backend).neg;
      fVar28 = (pnVar25->m_backend).fpclass;
      iVar2 = (pnVar25->m_backend).prec_elem;
      pnVar25 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar21 = pnVar25 + lVar1;
      pcVar13 = &local_f28;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
      }
      local_f28.exp = pnVar25[lVar1].m_backend.exp;
      local_f28.neg = pnVar25[lVar1].m_backend.neg;
      local_f28.fpclass = pnVar25[lVar1].m_backend.fpclass;
      local_f28.prec_elem = pnVar25[lVar1].m_backend.prec_elem;
      local_738.m_backend.data._M_elems[0] = uVar16;
      puVar22 = local_7a4;
      puVar26 = local_738.m_backend.data._M_elems + 1;
      for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar26 = *puVar22;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
      }
      local_738.m_backend.exp = iVar11;
      local_738.m_backend.neg = (bool)bVar17;
      local_738.m_backend.fpclass = fVar28;
      local_738.m_backend.prec_elem = iVar2;
      ::soplex::infinity::__tls_init();
      local_aa8.m_backend.fpclass = cpp_dec_float_finite;
      local_aa8.m_backend.prec_elem = 0x1c;
      local_aa8.m_backend.data._M_elems[0] = 0;
      local_aa8.m_backend.data._M_elems[1] = 0;
      local_aa8.m_backend.data._M_elems[2] = 0;
      local_aa8.m_backend.data._M_elems[3] = 0;
      local_aa8.m_backend.data._M_elems[4] = 0;
      local_aa8.m_backend.data._M_elems[5] = 0;
      local_aa8.m_backend.data._M_elems[6] = 0;
      local_aa8.m_backend.data._M_elems[7] = 0;
      local_aa8.m_backend.data._M_elems[8] = 0;
      local_aa8.m_backend.data._M_elems[9] = 0;
      local_aa8.m_backend.data._M_elems[10] = 0;
      local_aa8.m_backend.data._M_elems[0xb] = 0;
      local_aa8.m_backend.data._M_elems[0xc] = 0;
      local_aa8.m_backend.data._M_elems[0xd] = 0;
      local_aa8.m_backend.data._M_elems[0xe] = 0;
      local_aa8.m_backend.data._M_elems[0xf] = 0;
      local_aa8.m_backend.data._M_elems[0x10] = 0;
      local_aa8.m_backend.data._M_elems[0x11] = 0;
      local_aa8.m_backend.data._M_elems[0x12] = 0;
      local_aa8.m_backend.data._M_elems[0x13] = 0;
      local_aa8.m_backend.data._M_elems[0x14] = 0;
      local_aa8.m_backend.data._M_elems[0x15] = 0;
      local_aa8.m_backend.data._M_elems[0x16] = 0;
      local_aa8.m_backend.data._M_elems[0x17] = 0;
      local_aa8.m_backend.data._M_elems[0x18] = 0;
      local_aa8.m_backend.data._M_elems[0x19] = 0;
      local_aa8.m_backend.data._M_elems._104_5_ = 0;
      local_aa8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_aa8.m_backend.exp = 0;
      local_aa8.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_aa8,(double)CONCAT44(uStack_e24,local_e28));
      pTVar3 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var4 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      RVar7 = Tolerances::epsilon(pTVar3);
      bVar9 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_738,&local_aa8,RVar7);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      if (bVar9) {
        pcVar13 = &local_ca8;
        pcVar23 = &local_fe8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar23->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = local_ca8.exp;
        local_fe8.neg = local_ca8.neg;
        local_fe8.fpclass = local_ca8.fpclass;
        local_fe8.prec_elem = local_ca8.prec_elem;
        if (local_fe8.data._M_elems[0] != 0 || local_ca8.fpclass != cpp_dec_float_finite) {
          local_fe8.neg = (bool)(local_ca8.neg ^ 1);
        }
        if (((local_ca8.fpclass == cpp_dec_float_NaN) || (local_f28.fpclass == cpp_dec_float_NaN))
           || (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_fe8,&local_f28), -1 < iVar11)) {
          puVar22 = local_f28.data._M_elems + 1;
          pcVar13 = &local_d28;
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar13->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
          }
          uVar16 = local_f28.data._M_elems[0];
          iVar11 = local_f28.exp;
          bVar17 = local_f28.neg;
          fVar28 = local_f28.fpclass;
          iVar2 = local_f28.prec_elem;
        }
        else {
          uVar16 = local_ca8.data._M_elems[0];
          puVar22 = local_ca8.data._M_elems + 1;
          pcVar13 = &local_d28;
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar13->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
          }
          bVar17 = (uVar16 != 0 || local_ca8.fpclass != cpp_dec_float_finite) ^ local_ca8.neg;
          iVar11 = local_ca8.exp;
          fVar28 = local_ca8.fpclass;
          iVar2 = local_ca8.prec_elem;
        }
        pcVar13 = &local_d28;
        puVar22 = local_7a4;
        for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar22 = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
      }
      pcVar13 = &local_f28;
      pnVar20 = &local_638;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      local_638.m_backend.exp = local_f28.exp;
      local_638.m_backend.neg = local_f28.neg;
      local_638.m_backend.fpclass = local_f28.fpclass;
      local_638.m_backend.prec_elem = local_f28.prec_elem;
      ::soplex::infinity::__tls_init();
      local_b28.m_backend.fpclass = cpp_dec_float_finite;
      local_b28.m_backend.prec_elem = 0x1c;
      local_b28.m_backend.data._M_elems[0] = 0;
      local_b28.m_backend.data._M_elems[1] = 0;
      local_b28.m_backend.data._M_elems[2] = 0;
      local_b28.m_backend.data._M_elems[3] = 0;
      local_b28.m_backend.data._M_elems[4] = 0;
      local_b28.m_backend.data._M_elems[5] = 0;
      local_b28.m_backend.data._M_elems[6] = 0;
      local_b28.m_backend.data._M_elems[7] = 0;
      local_b28.m_backend.data._M_elems[8] = 0;
      local_b28.m_backend.data._M_elems[9] = 0;
      local_b28.m_backend.data._M_elems[10] = 0;
      local_b28.m_backend.data._M_elems[0xb] = 0;
      local_b28.m_backend.data._M_elems[0xc] = 0;
      local_b28.m_backend.data._M_elems[0xd] = 0;
      local_b28.m_backend.data._M_elems[0xe] = 0;
      local_b28.m_backend.data._M_elems[0xf] = 0;
      local_b28.m_backend.data._M_elems[0x10] = 0;
      local_b28.m_backend.data._M_elems[0x11] = 0;
      local_b28.m_backend.data._M_elems[0x12] = 0;
      local_b28.m_backend.data._M_elems[0x13] = 0;
      local_b28.m_backend.data._M_elems[0x14] = 0;
      local_b28.m_backend.data._M_elems[0x15] = 0;
      local_b28.m_backend.data._M_elems[0x16] = 0;
      local_b28.m_backend.data._M_elems[0x17] = 0;
      local_b28.m_backend.data._M_elems[0x18] = 0;
      local_b28.m_backend.data._M_elems[0x19] = 0;
      local_b28.m_backend.data._M_elems._104_5_ = 0;
      local_b28.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_b28.m_backend.exp = 0;
      local_b28.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_b28,local_e88);
      pTVar3 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var4 = (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      RVar7 = Tolerances::epsilon(pTVar3);
      bVar9 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_638,&local_b28,RVar7);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      if (bVar9) {
        pnVar25 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar13 = &local_ca8;
        if ((pnVar25[lVar1].m_backend.fpclass != cpp_dec_float_NaN) &&
           (local_ca8.fpclass != cpp_dec_float_NaN)) {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&pnVar25[lVar1].m_backend,pcVar13);
          pcVar13 = &local_ca8;
          if (0 < iVar12) {
            pcVar13 = &(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
          }
        }
        pcVar23 = pcVar13;
        pcVar24 = &local_f28;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar24->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar29 * -8 + 4);
        }
        local_f28.exp = pcVar13->exp;
        local_f28.neg = pcVar13->neg;
        local_f28.fpclass = pcVar13->fpclass;
        local_f28.prec_elem = pcVar13->prec_elem;
      }
      if (bVar8) {
        local_ba8.fpclass = cpp_dec_float_finite;
        local_ba8.prec_elem = 0x1c;
        local_ba8.data._M_elems[0] = 0;
        local_ba8.data._M_elems[1] = 0;
        local_ba8.data._M_elems[2] = 0;
        local_ba8.data._M_elems[3] = 0;
        local_ba8.data._M_elems[4] = 0;
        local_ba8.data._M_elems[5] = 0;
        local_ba8.data._M_elems[6] = 0;
        local_ba8.data._M_elems[7] = 0;
        local_ba8.data._M_elems[8] = 0;
        local_ba8.data._M_elems[9] = 0;
        local_ba8.data._M_elems[10] = 0;
        local_ba8.data._M_elems[0xb] = 0;
        local_ba8.data._M_elems[0xc] = 0;
        local_ba8.data._M_elems[0xd] = 0;
        local_ba8.data._M_elems[0xe] = 0;
        local_ba8.data._M_elems[0xf] = 0;
        local_ba8.data._M_elems[0x10] = 0;
        local_ba8.data._M_elems[0x11] = 0;
        local_ba8.data._M_elems[0x12] = 0;
        local_ba8.data._M_elems[0x13] = 0;
        local_ba8.data._M_elems[0x14] = 0;
        local_ba8.data._M_elems[0x15] = 0;
        local_ba8.data._M_elems[0x16] = 0;
        local_ba8.data._M_elems[0x17] = 0;
        local_ba8.data._M_elems[0x18] = 0;
        local_ba8.data._M_elems[0x19] = 0;
        local_ba8.data._M_elems._104_5_ = 0;
        local_ba8.data._M_elems[0x1b]._1_3_ = 0;
        local_ba8.exp = 0;
        local_ba8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_ba8,0.0);
        feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_1b8,this);
        local_fe8.data._M_elems[2] = 0;
        local_fe8.data._M_elems[3] = 0;
        local_fe8.data._M_elems[4] = 0;
        local_fe8.data._M_elems[5] = 0;
        local_fe8.data._M_elems[6] = 0;
        local_fe8.data._M_elems[7] = 0;
        local_fe8.data._M_elems[8] = 0;
        local_fe8.data._M_elems[9] = 0;
        local_fe8.data._M_elems[10] = 0;
        local_fe8.data._M_elems[0xb] = 0;
        local_fe8.data._M_elems[0xc] = 0;
        local_fe8.data._M_elems[0xd] = 0;
        local_fe8.data._M_elems[0xe] = 0;
        local_fe8.data._M_elems[0xf] = 0;
        local_fe8.data._M_elems[0x10] = 0;
        local_fe8.data._M_elems[0x11] = 0;
        local_fe8.data._M_elems[0x12] = 0;
        local_fe8.data._M_elems[0x13] = 0;
        local_fe8.data._M_elems[0x14] = 0;
        local_fe8.data._M_elems[0x15] = 0;
        local_fe8.data._M_elems[0x16] = 0;
        local_fe8.data._M_elems[0x17] = 0;
        local_fe8.data._M_elems[0x18] = 0;
        local_fe8.data._M_elems[0x19] = 0;
        local_fe8.data._M_elems._104_5_ = 0;
        local_fe8.data._M_elems[0x1b]._1_3_ = 0;
        local_fe8.data._M_elems[1] = 0;
        local_fe8.data._M_elems[0] = uVar16;
        puVar22 = local_7a4;
        puVar26 = local_fe8.data._M_elems + 1;
        for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar26 = *puVar22;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
          puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
        }
        local_fe8.prec_elem = iVar2;
        local_fe8.fpclass = fVar28;
        local_fe8.exp = iVar11;
        local_fe8.neg = (bool)bVar17;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_fe8,&local_ba8);
        if (((local_fe8.fpclass != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN))
           && (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_fe8,&local_1b8), iVar12 < 0)) {
          pcVar13 = &local_f28;
          pnVar20 = &local_6b8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_6b8.m_backend.exp = local_f28.exp;
          local_6b8.m_backend.neg = local_f28.neg;
          local_6b8.m_backend.fpclass = local_f28.fpclass;
          local_6b8.m_backend.prec_elem = local_f28.prec_elem;
          local_c28.m_backend.fpclass = cpp_dec_float_finite;
          local_c28.m_backend.prec_elem = 0x1c;
          local_c28.m_backend.data._M_elems[0] = 0;
          local_c28.m_backend.data._M_elems[1] = 0;
          local_c28.m_backend.data._M_elems[2] = 0;
          local_c28.m_backend.data._M_elems[3] = 0;
          local_c28.m_backend.data._M_elems[4] = 0;
          local_c28.m_backend.data._M_elems[5] = 0;
          local_c28.m_backend.data._M_elems[6] = 0;
          local_c28.m_backend.data._M_elems[7] = 0;
          local_c28.m_backend.data._M_elems[8] = 0;
          local_c28.m_backend.data._M_elems[9] = 0;
          local_c28.m_backend.data._M_elems[10] = 0;
          local_c28.m_backend.data._M_elems[0xb] = 0;
          local_c28.m_backend.data._M_elems[0xc] = 0;
          local_c28.m_backend.data._M_elems[0xd] = 0;
          local_c28.m_backend.data._M_elems[0xe] = 0;
          local_c28.m_backend.data._M_elems[0xf] = 0;
          local_c28.m_backend.data._M_elems[0x10] = 0;
          local_c28.m_backend.data._M_elems[0x11] = 0;
          local_c28.m_backend.data._M_elems[0x12] = 0;
          local_c28.m_backend.data._M_elems[0x13] = 0;
          local_c28.m_backend.data._M_elems[0x14] = 0;
          local_c28.m_backend.data._M_elems[0x15] = 0;
          local_c28.m_backend.data._M_elems[0x16] = 0;
          local_c28.m_backend.data._M_elems[0x17] = 0;
          local_c28.m_backend.data._M_elems[0x18] = 0;
          local_c28.m_backend.data._M_elems[0x19] = 0;
          local_c28.m_backend.data._M_elems._104_5_ = 0;
          local_c28.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_c28.m_backend.exp = 0;
          local_c28.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_c28,0.0);
          feastol(&local_b0,this);
          bVar9 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_6b8,&local_c28,&local_b0);
          if (bVar9) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)
                       (local_e40.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar1),0.0);
            goto LAB_0056e448;
          }
        }
        bVar8 = false;
      }
LAB_0056e448:
      pnVar25 = local_e58.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar1;
      (pnVar25->m_backend).data._M_elems[0] = uVar16;
      puVar22 = local_7a4;
      puVar26 = (pnVar25->m_backend).data._M_elems + 1;
      for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar26 = *puVar22;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
      }
      (pnVar25->m_backend).exp = iVar11;
      (pnVar25->m_backend).neg = (bool)bVar17;
      (pnVar25->m_backend).fpclass = fVar28;
      (pnVar25->m_backend).prec_elem = iVar2;
      pcVar13 = &local_f28;
      pnVar25 = local_e70.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar1;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_f28.exp;
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_f28.neg;
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_f28.fpclass;
      local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_f28.prec_elem;
      if (((local_f58.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass == cpp_dec_float_NaN)
          || (local_f40.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass ==
              cpp_dec_float_NaN)) ||
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_f58.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,
                              &local_f40.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend),
         iVar12 < 1)) {
        if (((local_f58.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass ==
              cpp_dec_float_NaN) ||
            (local_f40.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass == cpp_dec_float_NaN
            )) || (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_f58.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend,
                                       &local_f40.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend),
                  -1 < iVar12)) {
          local_da8.fpclass = cpp_dec_float_finite;
          local_da8.prec_elem = 0x1c;
          local_da8.data._M_elems[2] = 0;
          local_da8.data._M_elems[3] = 0;
          local_da8.data._M_elems[4] = 0;
          local_da8.data._M_elems[5] = 0;
          local_da8.data._M_elems[6] = 0;
          local_da8.data._M_elems[7] = 0;
          local_da8.data._M_elems[8] = 0;
          local_da8.data._M_elems[9] = 0;
          local_da8.data._M_elems[10] = 0;
          local_da8.data._M_elems[0xb] = 0;
          local_da8.data._M_elems[0xc] = 0;
          local_da8.data._M_elems[0xd] = 0;
          local_da8.data._M_elems[0xe] = 0;
          local_da8.data._M_elems[0xf] = 0;
          local_da8.data._M_elems[0x10] = 0;
          local_da8.data._M_elems[0x11] = 0;
          local_da8.data._M_elems[0x12] = 0;
          local_da8.data._M_elems[0x13] = 0;
          local_da8.data._M_elems[0x14] = 0;
          local_da8.data._M_elems[0x15] = 0;
          local_da8.data._M_elems[0x16] = 0;
          local_da8.data._M_elems[0x17] = 0;
          local_da8.data._M_elems[0x18] = 0;
          local_da8.data._M_elems[0x19] = 0;
          local_da8.data._M_elems._104_5_ = 0;
          local_da8.data._M_elems[0x1b]._1_3_ = 0;
          local_da8.exp = 0;
          local_da8.neg = false;
          local_da8.data._M_elems[1] = 0;
          local_da8.data._M_elems[0] = uVar16;
          puVar22 = local_7a4;
          puVar26 = local_da8.data._M_elems + 1;
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar26 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
          }
          local_da8.prec_elem = iVar2;
          local_da8.fpclass = fVar28;
          local_da8.exp = iVar11;
          local_da8.neg = (bool)bVar17;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_da8,&local_f28);
          local_d28.fpclass = cpp_dec_float_finite;
          local_d28.prec_elem = 0x1c;
          local_d28.data._M_elems[0] = 0;
          local_d28.data._M_elems[1] = 0;
          local_d28.data._M_elems[2] = 0;
          local_d28.data._M_elems[3] = 0;
          local_d28.data._M_elems[4] = 0;
          local_d28.data._M_elems[5] = 0;
          local_d28.data._M_elems[6] = 0;
          local_d28.data._M_elems[7] = 0;
          local_d28.data._M_elems[8] = 0;
          local_d28.data._M_elems[9] = 0;
          local_d28.data._M_elems[10] = 0;
          local_d28.data._M_elems[0xb] = 0;
          local_d28.data._M_elems[0xc] = 0;
          local_d28.data._M_elems[0xd] = 0;
          local_d28.data._M_elems[0xe] = 0;
          local_d28.data._M_elems[0xf] = 0;
          local_d28.data._M_elems[0x10] = 0;
          local_d28.data._M_elems[0x11] = 0;
          local_d28.data._M_elems[0x12] = 0;
          local_d28.data._M_elems[0x13] = 0;
          local_d28.data._M_elems[0x14] = 0;
          local_d28.data._M_elems[0x15] = 0;
          local_d28.data._M_elems[0x16] = 0;
          local_d28.data._M_elems[0x17] = 0;
          local_d28.data._M_elems[0x18] = 0;
          local_d28.data._M_elems[0x19] = 0;
          local_d28.data._M_elems._104_5_ = 0;
          local_d28.data._M_elems[0x1b]._1_3_ = 0;
          local_d28.exp = 0;
          local_d28.neg = false;
          local_fe8.fpclass = cpp_dec_float_finite;
          local_fe8.prec_elem = 0x1c;
          local_fe8.data._M_elems[0] = 0;
          local_fe8.data._M_elems[1] = 0;
          local_fe8.data._M_elems[2] = 0;
          local_fe8.data._M_elems[3] = 0;
          local_fe8.data._M_elems[4] = 0;
          local_fe8.data._M_elems[5] = 0;
          local_fe8.data._M_elems[6] = 0;
          local_fe8.data._M_elems[7] = 0;
          local_fe8.data._M_elems[8] = 0;
          local_fe8.data._M_elems[9] = 0;
          local_fe8.data._M_elems[10] = 0;
          local_fe8.data._M_elems[0xb] = 0;
          local_fe8.data._M_elems[0xc] = 0;
          local_fe8.data._M_elems[0xd] = 0;
          local_fe8.data._M_elems[0xe] = 0;
          local_fe8.data._M_elems[0xf] = 0;
          local_fe8.data._M_elems[0x10] = 0;
          local_fe8.data._M_elems[0x11] = 0;
          local_fe8.data._M_elems[0x12] = 0;
          local_fe8.data._M_elems[0x13] = 0;
          local_fe8.data._M_elems[0x14] = 0;
          local_fe8.data._M_elems[0x15] = 0;
          local_fe8.data._M_elems[0x16] = 0;
          local_fe8.data._M_elems[0x17] = 0;
          local_fe8.data._M_elems[0x18] = 0;
          local_fe8.data._M_elems[0x19] = 0;
          local_fe8.data._M_elems._104_5_ = 0;
          local_fe8.data._M_elems[0x1b]._1_3_ = 0;
          local_fe8.exp = 0;
          local_fe8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_fe8,2.0);
          lVar18 = local_f60;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_d28,&local_da8,&local_fe8);
          pcVar13 = &local_d28;
          pnVar25 = local_ea0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar1;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar25->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar29 * -8 + 4);
            pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 4);
          }
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_d28.exp;
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_d28.neg;
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_d28.fpclass;
          local_ea0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_d28.prec_elem
          ;
        }
        else {
          pnVar25 = local_ea0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar1;
          (pnVar25->m_backend).data._M_elems[0] = uVar16;
          puVar22 = local_7a4;
          puVar26 = (pnVar25->m_backend).data._M_elems + 1;
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar26 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
          }
          (pnVar25->m_backend).exp = iVar11;
          (pnVar25->m_backend).neg = (bool)bVar17;
          (pnVar25->m_backend).fpclass = fVar28;
          (pnVar25->m_backend).prec_elem = iVar2;
          lVar18 = local_f60;
        }
      }
      else {
        pcVar13 = &local_f28;
        pnVar25 = local_ea0.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar1;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar25->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4)
          ;
          pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.exp = local_f28.exp;
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.neg = local_f28.neg;
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.fpclass = local_f28.fpclass;
        local_ea0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend.prec_elem = local_f28.prec_elem;
        lVar18 = local_f60;
      }
      pcVar24 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar23 = &local_e58.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_fe8.fpclass = cpp_dec_float_finite;
      local_fe8.prec_elem = 0x1c;
      local_fe8.data._M_elems[0] = 0;
      local_fe8.data._M_elems[1] = 0;
      local_fe8.data._M_elems[2] = 0;
      local_fe8.data._M_elems[3] = 0;
      local_fe8.data._M_elems[4] = 0;
      local_fe8.data._M_elems[5] = 0;
      local_fe8.data._M_elems[6] = 0;
      local_fe8.data._M_elems[7] = 0;
      local_fe8.data._M_elems[8] = 0;
      local_fe8.data._M_elems[9] = 0;
      local_fe8.data._M_elems[10] = 0;
      local_fe8.data._M_elems[0xb] = 0;
      local_fe8.data._M_elems[0xc] = 0;
      local_fe8.data._M_elems[0xd] = 0;
      local_fe8.data._M_elems[0xe] = 0;
      local_fe8.data._M_elems[0xf] = 0;
      local_fe8.data._M_elems[0x10] = 0;
      local_fe8.data._M_elems[0x11] = 0;
      local_fe8.data._M_elems[0x12] = 0;
      local_fe8.data._M_elems[0x13] = 0;
      local_fe8.data._M_elems[0x14] = 0;
      local_fe8.data._M_elems[0x15] = 0;
      local_fe8.data._M_elems[0x16] = 0;
      local_fe8.data._M_elems[0x17] = 0;
      local_fe8.data._M_elems[0x18] = 0;
      local_fe8.data._M_elems[0x19] = 0;
      local_fe8.data._M_elems._104_5_ = 0;
      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
      local_fe8.exp = 0;
      local_fe8.neg = false;
      pcVar13 = pcVar24;
      if ((&local_fe8 != pcVar23) && (pcVar13 = pcVar23, &local_fe8 != pcVar24)) {
        pcVar23 = pcVar24;
        pcVar27 = &local_fe8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = pcVar24->exp;
        local_fe8.neg = pcVar24->neg;
        local_fe8.fpclass = pcVar24->fpclass;
        local_fe8.prec_elem = pcVar24->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_fe8,pcVar13);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_2b8,&local_fe8);
      pcVar24 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar23 = &local_e70.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_fe8.fpclass = cpp_dec_float_finite;
      local_fe8.prec_elem = 0x1c;
      local_fe8.data._M_elems[0] = 0;
      local_fe8.data._M_elems[1] = 0;
      local_fe8.data._M_elems[2] = 0;
      local_fe8.data._M_elems[3] = 0;
      local_fe8.data._M_elems[4] = 0;
      local_fe8.data._M_elems[5] = 0;
      local_fe8.data._M_elems[6] = 0;
      local_fe8.data._M_elems[7] = 0;
      local_fe8.data._M_elems[8] = 0;
      local_fe8.data._M_elems[9] = 0;
      local_fe8.data._M_elems[10] = 0;
      local_fe8.data._M_elems[0xb] = 0;
      local_fe8.data._M_elems[0xc] = 0;
      local_fe8.data._M_elems[0xd] = 0;
      local_fe8.data._M_elems[0xe] = 0;
      local_fe8.data._M_elems[0xf] = 0;
      local_fe8.data._M_elems[0x10] = 0;
      local_fe8.data._M_elems[0x11] = 0;
      local_fe8.data._M_elems[0x12] = 0;
      local_fe8.data._M_elems[0x13] = 0;
      local_fe8.data._M_elems[0x14] = 0;
      local_fe8.data._M_elems[0x15] = 0;
      local_fe8.data._M_elems[0x16] = 0;
      local_fe8.data._M_elems[0x17] = 0;
      local_fe8.data._M_elems[0x18] = 0;
      local_fe8.data._M_elems[0x19] = 0;
      local_fe8.data._M_elems._104_5_ = 0;
      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
      local_fe8.exp = 0;
      local_fe8.neg = false;
      pcVar13 = pcVar24;
      if ((&local_fe8 != pcVar23) && (pcVar13 = pcVar23, &local_fe8 != pcVar24)) {
        pcVar23 = pcVar24;
        pcVar27 = &local_fe8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = pcVar24->exp;
        local_fe8.neg = pcVar24->neg;
        local_fe8.fpclass = pcVar24->fpclass;
        local_fe8.prec_elem = pcVar24->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_fe8,pcVar13);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_338,&local_fe8);
      pcVar23 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      pcVar24 = &local_ea0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].m_backend;
      local_fe8.fpclass = cpp_dec_float_finite;
      local_fe8.prec_elem = 0x1c;
      local_fe8.data._M_elems[0] = 0;
      local_fe8.data._M_elems[1] = 0;
      local_fe8.data._M_elems[2] = 0;
      local_fe8.data._M_elems[3] = 0;
      local_fe8.data._M_elems[4] = 0;
      local_fe8.data._M_elems[5] = 0;
      local_fe8.data._M_elems[6] = 0;
      local_fe8.data._M_elems[7] = 0;
      local_fe8.data._M_elems[8] = 0;
      local_fe8.data._M_elems[9] = 0;
      local_fe8.data._M_elems[10] = 0;
      local_fe8.data._M_elems[0xb] = 0;
      local_fe8.data._M_elems[0xc] = 0;
      local_fe8.data._M_elems[0xd] = 0;
      local_fe8.data._M_elems[0xe] = 0;
      local_fe8.data._M_elems[0xf] = 0;
      local_fe8.data._M_elems[0x10] = 0;
      local_fe8.data._M_elems[0x11] = 0;
      local_fe8.data._M_elems[0x12] = 0;
      local_fe8.data._M_elems[0x13] = 0;
      local_fe8.data._M_elems[0x14] = 0;
      local_fe8.data._M_elems[0x15] = 0;
      local_fe8.data._M_elems[0x16] = 0;
      local_fe8.data._M_elems[0x17] = 0;
      local_fe8.data._M_elems[0x18] = 0;
      local_fe8.data._M_elems[0x19] = 0;
      local_fe8.data._M_elems._104_5_ = 0;
      local_fe8.data._M_elems[0x1b]._1_3_ = 0;
      local_fe8.exp = 0;
      local_fe8.neg = false;
      pcVar13 = pcVar23;
      if ((&local_fe8 != pcVar24) && (pcVar13 = pcVar24, &local_fe8 != pcVar23)) {
        pcVar24 = pcVar23;
        pcVar27 = &local_fe8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
          pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar29 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar29 * -8 + 4);
        }
        local_fe8.exp = pcVar23->exp;
        local_fe8.neg = pcVar23->neg;
        local_fe8.fpclass = pcVar23->fpclass;
        local_fe8.prec_elem = pcVar23->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_fe8,pcVar13);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_3b8,&local_fe8);
      lVar14 = local_e10;
    } while (1 < lVar18);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_dc0,&local_e58);
  bVar9 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)&local_dc0);
  if (local_dc0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_dc0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_dc0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_dc0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar9) && (local_2b8.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_2b8,&(this->m_cutoffbound).m_backend);
    if (0 < iVar11) {
      pcVar13 = &local_2b8;
      pnVar20 = &this->m_cutoffbound;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar29 * -8 + 4);
      }
      (this->m_cutoffbound).m_backend.exp = local_2b8.exp;
      (this->m_cutoffbound).m_backend.neg = local_2b8.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_2b8.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_2b8.prec_elem;
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_dd8,&local_e70);
  bVar9 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)&local_dd8);
  if (local_dd8.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_dd8.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_dd8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_dd8.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar9) && (local_338.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_338,&(this->m_cutoffbound).m_backend);
    if (0 < iVar11) {
      pcVar13 = &local_338;
      pnVar20 = &this->m_cutoffbound;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar29 * -8 + 4);
      }
      (this->m_cutoffbound).m_backend.exp = local_338.exp;
      (this->m_cutoffbound).m_backend.neg = local_338.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_338.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_338.prec_elem;
    }
  }
  if (bVar8) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::vector(&local_df0,&local_e40);
    bVar8 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)&local_df0);
    if (local_df0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_df0.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_df0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_df0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar8 = false;
  }
  if (((bVar8 != false) && (local_238.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_238,&(this->m_cutoffbound).m_backend);
    if (0 < iVar11) {
      pcVar13 = &local_238;
      pnVar20 = &this->m_cutoffbound;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar29 * -8 + 4);
      }
      (this->m_cutoffbound).m_backend.exp = local_238.exp;
      (this->m_cutoffbound).m_backend.neg = local_238.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_238.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_238.prec_elem;
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&local_e08,&local_ea0);
  bVar8 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)&local_e08);
  if (local_e08.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e08.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e08.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e08.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((bVar8) && (local_3b8.fpclass != cpp_dec_float_NaN)) &&
     ((this->m_cutoffbound).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_3b8,&(this->m_cutoffbound).m_backend);
    if (0 < iVar11) {
      pcVar13 = &local_3b8;
      pnVar20 = &this->m_cutoffbound;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar29 * -8 + 4);
      }
      (this->m_cutoffbound).m_backend.exp = local_3b8.exp;
      (this->m_cutoffbound).m_backend.neg = local_3b8.neg;
      (this->m_cutoffbound).m_backend.fpclass = local_3b8.fpclass;
      (this->m_cutoffbound).m_backend.prec_elem = local_3b8.prec_elem;
    }
  }
  if (local_f58.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f58.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f58.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f58.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f40.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f40.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f40.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f40.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_ea0.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ea0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_ea0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ea0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e70.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e70.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e70.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e70.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e58.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e58.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e58.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e40.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e40.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e40.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e40.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}